

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipv4_address_no_zone.c
# Opt level: O3

LY_ERR lyplg_type_store_ipv4_address_no_zone
                 (ly_ctx *ctx,lysc_type *type,void *value,size_t value_len,uint32_t options,
                 LY_VALUE_FORMAT format,void *UNUSED_prefix_data,uint32_t hints,
                 lysc_node *UNUSED_ctx_node,lyd_value *storage,lys_glob_unres *UNUSED_unres,
                 ly_err_item **err)

{
  int iVar1;
  LY_ERR LVar2;
  char *err_format;
  
  storage->_canonical = (char *)0x0;
  storage->realtype = (lysc_type *)0x0;
  (storage->field_2).dec64 = 0;
  *(undefined8 *)((long)&storage->field_2 + 8) = 0;
  *(undefined8 *)((long)&storage->field_2 + 0x10) = 0;
  storage->realtype = type;
  if (format == LY_VALUE_LYB) {
    if (value_len == 4) {
      (storage->field_2).int32 = *value;
      LVar2 = LY_SUCCESS;
    }
    else {
      err_format = "Invalid LYB ipv4-address-no-zone value size %zu (expected 4).";
LAB_001bd518:
      LVar2 = ly_err_new(err,LY_EVALID,LYVE_DATA,(char *)0x0,(char *)0x0,err_format,value_len);
    }
  }
  else {
    LVar2 = lyplg_type_check_hints(hints,(char *)value,value_len,type->basetype,(int *)0x0,err);
    if (LVar2 == LY_SUCCESS) {
      if ((options & 1) == 0) {
        value = strndup((char *)value,value_len);
        LVar2 = LY_EMEM;
        if ((char *)value == (char *)0x0) {
          value = (char *)0x0;
          goto LAB_001bd531;
        }
        options = 1;
      }
      iVar1 = inet_pton(2,(char *)value,&storage->field_2);
      if (iVar1 != 0) {
        LVar2 = lydict_insert_zc(ctx,(char *)value,&storage->_canonical);
        goto LAB_001bd53f;
      }
      err_format = "Failed to convert IPv4 address \"%s\".";
      value_len = (size_t)value;
      goto LAB_001bd518;
    }
  }
LAB_001bd531:
  if ((options & 1) != 0) {
    free(value);
  }
LAB_001bd53f:
  if (LVar2 != LY_SUCCESS) {
    lyplg_type_free_simple(ctx,storage);
  }
  return LVar2;
}

Assistant:

static LY_ERR
lyplg_type_store_ipv4_address_no_zone(const struct ly_ctx *ctx, const struct lysc_type *type, const void *value,
        size_t value_len, uint32_t options, LY_VALUE_FORMAT format, void *UNUSED(prefix_data), uint32_t hints,
        const struct lysc_node *UNUSED(ctx_node), struct lyd_value *storage, struct lys_glob_unres *UNUSED(unres),
        struct ly_err_item **err)
{
    LY_ERR ret = LY_SUCCESS;
    struct lyd_value_ipv4_address_no_zone *val;

    /* init storage */
    memset(storage, 0, sizeof *storage);
    LYPLG_TYPE_VAL_INLINE_PREPARE(storage, val);
    LY_CHECK_ERR_GOTO(!val, ret = LY_EMEM, cleanup);
    storage->realtype = type;

    if (format == LY_VALUE_LYB) {
        /* validation */
        if (value_len != 4) {
            ret = ly_err_new(err, LY_EVALID, LYVE_DATA, NULL, NULL, "Invalid LYB ipv4-address-no-zone value size %zu "
                    "(expected 4).", value_len);
            goto cleanup;
        }

        /* store IP address */
        memcpy(&val->addr, value, 4);

        /* success */
        goto cleanup;
    }

    /* check hints */
    ret = lyplg_type_check_hints(hints, value, value_len, type->basetype, NULL, err);
    LY_CHECK_GOTO(ret, cleanup);

    /* we always need a dynamic value */
    if (!(options & LYPLG_TYPE_STORE_DYNAMIC)) {
        value = strndup(value, value_len);
        LY_CHECK_ERR_GOTO(!value, ret = LY_EMEM, cleanup);

        options |= LYPLG_TYPE_STORE_DYNAMIC;
    }

    /* get the network-byte order address, validates the value */
    if (!inet_pton(AF_INET, value, &val->addr)) {
        ret = ly_err_new(err, LY_EVALID, LYVE_DATA, NULL, NULL, "Failed to convert IPv4 address \"%s\".", (char *)value);
        goto cleanup;
    }

    /* store canonical value */
    ret = lydict_insert_zc(ctx, (char *)value, &storage->_canonical);
    options &= ~LYPLG_TYPE_STORE_DYNAMIC;
    LY_CHECK_GOTO(ret, cleanup);

cleanup:
    if (options & LYPLG_TYPE_STORE_DYNAMIC) {
        free((void *)value);
    }

    if (ret) {
        lyplg_type_free_simple(ctx, storage);
    }
    return ret;
}